

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O0

uint __thiscall Atmosphere::layer_search(Atmosphere *this,double h)

{
  size_type sVar1;
  reference pvVar2;
  uint local_20;
  uint i;
  uint layer;
  double h_local;
  Atmosphere *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->H);
    if (sVar1 <= local_20) {
      return 0;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->H,(ulong)local_20);
    if ((*pvVar2 <= h) &&
       (pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->H,(ulong)(local_20 + 1)), h < *pvVar2)) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

unsigned int layer_search(double h) {

        unsigned int layer = 0;
        for (unsigned int i = 0; i < this->H.size(); i++) {
            if (this->H[i] <= h && h < this->H[i + 1]) {
                layer = i;
                break;
            } else {
                continue;
            }
        }
        return layer;
    }